

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t validate_number_field(char *p_field,size_t i_size)

{
  char cVar1;
  bool bVar2;
  ulong local_30;
  size_t i;
  uchar marker;
  size_t i_size_local;
  char *p_field_local;
  
  cVar1 = *p_field;
  if (((cVar1 != -0x80) && (cVar1 != -1)) && (cVar1 != '\0')) {
    local_30 = 0;
    while( true ) {
      bVar2 = false;
      if (local_30 < i_size) {
        bVar2 = p_field[local_30] == ' ';
      }
      if (!bVar2) break;
      local_30 = local_30 + 1;
    }
    while( true ) {
      bVar2 = false;
      if ((local_30 < i_size) && (bVar2 = false, '/' < p_field[local_30])) {
        bVar2 = p_field[local_30] < '8';
      }
      if (!bVar2) break;
      local_30 = local_30 + 1;
    }
    for (; local_30 < i_size; local_30 = local_30 + 1) {
      if ((p_field[local_30] != ' ') && (p_field[local_30] != '\0')) {
        return L'\0';
      }
    }
  }
  return L'\x01';
}

Assistant:

static int
validate_number_field(const char* p_field, size_t i_size)
{
	unsigned char marker = (unsigned char)p_field[0];
	if (marker == 128 || marker == 255 || marker == 0) {
		/* Base-256 marker, there's nothing we can check. */
		return 1;
	} else {
		/* Must be octal */
		size_t i = 0;
		/* Skip any leading spaces */
		while (i < i_size && p_field[i] == ' ') {
			++i;
		}
		/* Skip octal digits. */
		while (i < i_size && p_field[i] >= '0' && p_field[i] <= '7') {
			++i;
		}
		/* Any remaining characters must be space or NUL padding. */
		while (i < i_size) {
			if (p_field[i] != ' ' && p_field[i] != 0) {
				return 0;
			}
			++i;
		}
		return 1;
	}
}